

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O0

void ncnn::lstm_dynamic_quantize
               (Mat *bottom_blob,Mat *bottom_blob_int8,Mat *bottom_blob_int8_descales,Option *opt)

{
  Mat *in_RCX;
  long *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float fVar1;
  float scale;
  float absmax;
  char *outptr;
  float *ptr;
  float *in_stack_00000018;
  int t;
  int T;
  int size;
  Allocator *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar2;
  int _h;
  
  iVar2 = *(int *)(in_RDI + 0x2c);
  _h = *(int *)(in_RDI + 0x30);
  Mat::create(in_RSI,(int)((ulong)in_RDX >> 0x20),(size_t)in_RCX,iVar2,
              (Allocator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  Mat::create(in_RCX,iVar2,_h,CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff98);
  for (iVar2 = 0; iVar2 < _h; iVar2 = iVar2 + 1) {
    fVar1 = lstm_dynamic_quantize_get_absmax(in_stack_00000018,ptr._4_4_);
    *(float *)(*in_RDX + (long)iVar2 * 4) = fVar1 / 127.0;
    lstm_dynamic_quantize_scale2int8((float *)opt,size,(float)T,(char *)in_stack_00000018);
  }
  return;
}

Assistant:

static void lstm_dynamic_quantize(const Mat& bottom_blob, Mat& bottom_blob_int8, Mat& bottom_blob_int8_descales, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    // dynamic quantize bottom_blob
    bottom_blob_int8_descales.create(T, (size_t)4u, 1, opt.blob_allocator);

    bottom_blob_int8.create(size, T, (size_t)1u, opt.blob_allocator);

    // fp32
    for (int t = 0; t < T; t++)
    {
        const float* ptr = bottom_blob.row(t);
        signed char* outptr = bottom_blob_int8.row<signed char>(t);

        const float absmax = lstm_dynamic_quantize_get_absmax(ptr, size);

        bottom_blob_int8_descales[t] = absmax / 127.f;

        const float scale = 127.f / absmax;
        lstm_dynamic_quantize_scale2int8(ptr, size, scale, outptr);
    }
}